

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O0

void vu_draw_config(t_vu *x,_glist *glist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  _glist *p_Var13;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 uVar16;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 uVar18;
  undefined4 *puVar17;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 uVar19;
  int local_1a4;
  char *local_188;
  char *local_170;
  int local_158;
  undefined4 local_138 [2];
  t_atom fontatoms [3];
  char tag [128];
  uint local_80;
  int i;
  int k4;
  int yyy;
  int led_col;
  int k3;
  int k2;
  int k1;
  int end;
  int quad3;
  int quad1;
  int mid;
  int w4;
  int fs;
  int ledw;
  int ioh;
  int iow;
  int vmargin;
  int hmargin;
  int ypos;
  int xpos;
  _glist *canvas;
  t_iemgui *iemgui;
  int zoom;
  _glist *glist_local;
  t_vu *x_local;
  
  uVar19 = (undefined4)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  uVar16 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  p_Var13 = glist_getcanvas(glist);
  iVar3 = text_xpix((t_text *)x,glist);
  iVar4 = text_ypix((t_text *)x,glist);
  iVar5 = x->x_led_size * iVar1;
  iVar6 = (x->x_gui).x_w / 4;
  uVar7 = iVar3 + (x->x_gui).x_w / 2;
  uVar8 = iVar3 + iVar6 + iVar1;
  iVar6 = (iVar3 + (x->x_gui).x_w) - iVar6;
  uVar9 = iVar3 + (x->x_gui).x_w + iVar1 * 4;
  iVar10 = (x->x_led_size + 1) * iVar1;
  iVar11 = iVar10 / 2;
  local_138[0] = 2;
  fontatoms[0]._0_8_ = gensym((x->x_gui).x_font);
  fontatoms[0].a_w.w_float = 1.4013e-45;
  fontatoms[1].a_type = (t_atomtype)(float)(-(x->x_gui).x_fontsize * iVar1);
  fontatoms[1].a_w.w_float = 2.8026e-45;
  fontatoms[2]._0_8_ = gensym(sys_fontweight);
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxBASE",x);
  uVar14 = CONCAT44(uVar16,iVar4 + iVar1 * -2);
  uVar15 = CONCAT44(uVar19,iVar4 + (x->x_gui).x_h + iVar1 * 2);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var13,"coords",&fontatoms[2].a_w,(ulong)(uint)(iVar3 - iVar1)
              ,uVar14,CONCAT44(uVar18,iVar3 + (x->x_gui).x_w + iVar1),uVar15);
  uVar14 = CONCAT44((int)((ulong)uVar14 >> 0x20),iVar1);
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-width",uVar14,
              "-fill",CONCAT44((int)((ulong)uVar15 >> 0x20),(x->x_gui).x_bcol));
  uVar16 = (undefined4)((ulong)uVar14 >> 0x20);
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxSCALE",x);
  puVar17 = local_138;
  if (((uint)(x->x_gui).x_fsf >> 0x18 & 1) == 0) {
    local_158 = (x->x_gui).x_lcol;
  }
  else {
    local_158 = 0xff;
  }
  uVar15 = CONCAT44(uVar16,3);
  uVar14 = 0;
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-font",uVar15,
              puVar17,"-fill",local_158);
  uVar16 = (undefined4)((ulong)uVar15 >> 0x20);
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxRLED",x);
  local_170 = (char *)CONCAT44(uVar16,iVar5);
  pdgui_vmess((char *)0x0,"crs ri",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-width",local_170);
  for (local_80 = 1; uVar19 = (undefined4)((ulong)uVar14 >> 0x20),
      uVar18 = (undefined4)((ulong)puVar17 >> 0x20), uVar16 = (undefined4)((ulong)local_170 >> 0x20)
      , (int)local_80 < 0x2a; local_80 = local_80 + 1) {
    sprintf((char *)&fontatoms[2].a_w.w_index,"%lxRLED%d",x,(ulong)local_80);
    iVar2 = iemgui_vu_col[(int)local_80];
    iVar12 = (iVar4 - iVar11) + iVar10 * (0x29 - local_80);
    uVar15 = CONCAT44(uVar16,iVar12);
    puVar17 = (undefined4 *)CONCAT44(uVar18,iVar6);
    uVar14 = CONCAT44(uVar19,iVar12);
    pdgui_vmess((char *)0x0,"crs iiii",p_Var13,"coords",&fontatoms[2].a_w,(ulong)uVar8,uVar15,
                puVar17,uVar14);
    uVar15 = CONCAT44((int)((ulong)uVar15 >> 0x20),iemgui_color_hex[iVar2]);
    pdgui_vmess((char *)0x0,"crs rk",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-fill",uVar15);
    uVar16 = (undefined4)((ulong)uVar15 >> 0x20);
    sprintf((char *)&fontatoms[2].a_w.w_index,"%lxSCALE%d",x);
    local_170 = (char *)CONCAT44(uVar16,iVar12 + iVar11);
    pdgui_vmess((char *)0x0,"crs ii",p_Var13,"coords",&fontatoms[2].a_w,(ulong)uVar9,local_170);
    if ((local_80 + 2 & 3) != 0) {
      if (x->x_scale == 0) {
        local_170 = "";
      }
      else {
        local_170 = iemgui_vu_scale_str[(int)local_80];
      }
      pdgui_vmess((char *)0x0,"crs rs",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-text",local_170);
    }
  }
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxSCALE%d",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var13,"coords",&fontatoms[2].a_w,(ulong)uVar9,
              CONCAT44(uVar16,(iVar4 - iVar11) + iVar11));
  if (x->x_scale == 0) {
    local_188 = "";
  }
  else {
    local_188 = iemgui_vu_scale_str[0x29];
  }
  pdgui_vmess((char *)0x0,"crs rs",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-text",local_188);
  uVar16 = (undefined4)((ulong)local_188 >> 0x20);
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxRCOVER",x);
  uVar14 = CONCAT44(uVar16,iVar4 - iVar1);
  uVar15 = CONCAT44(uVar19,(iVar4 - iVar1) + iVar10 * 0x28);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var13,"coords",&fontatoms[2].a_w,(ulong)(uVar8 - iVar1),
              uVar14,CONCAT44(uVar18,iVar6 + iVar1),uVar15);
  uVar14 = CONCAT44((int)((ulong)uVar14 >> 0x20),(x->x_gui).x_bcol);
  uVar18 = 0;
  uVar15 = CONCAT44((int)((ulong)uVar15 >> 0x20),(x->x_gui).x_bcol);
  pdgui_vmess((char *)0x0,"crs rk rk",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-fill",uVar14,
              "-outline",uVar15);
  uVar19 = (undefined4)((ulong)uVar15 >> 0x20);
  uVar16 = (undefined4)((ulong)uVar14 >> 0x20);
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxPLED",x);
  uVar14 = CONCAT44(uVar16,iVar4 + iVar1 * 10);
  uVar15 = CONCAT44(uVar19,iVar4 + iVar1 * 10);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var13,"coords",&fontatoms[2].a_w,(ulong)uVar7,uVar14,
              CONCAT44(uVar18,uVar7),uVar15);
  uVar14 = CONCAT44((int)((ulong)uVar14 >> 0x20),iVar5 + iVar1);
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-width",uVar14,
              "-fill",CONCAT44((int)((ulong)uVar15 >> 0x20),(x->x_gui).x_bcol));
  uVar16 = (undefined4)((ulong)uVar14 >> 0x20);
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxLABEL",x);
  uVar14 = CONCAT44(uVar16,iVar4 + (x->x_gui).x_ldy * iVar1);
  pdgui_vmess((char *)0x0,"crs ii",p_Var13,"coords",&fontatoms[2].a_w,
              (ulong)(uint)(iVar3 + (x->x_gui).x_ldx * iVar1),uVar14);
  if (((uint)(x->x_gui).x_fsf >> 0x18 & 1) == 0) {
    local_1a4 = (x->x_gui).x_lcol;
  }
  else {
    local_1a4 = 0xff;
  }
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var13,"itemconfigure",&fontatoms[2].a_w,"-font",
              CONCAT44((int)((ulong)uVar14 >> 0x20),3),local_138,"-fill",local_1a4);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  x->field_0x4b8 = x->field_0x4b8 & 0xfd | 2;
  x->field_0x4b8 = x->field_0x4b8 & 0xfe | 1;
  return;
}

Assistant:

static void vu_draw_config(t_vu* x, t_glist* glist)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_iemgui *iemgui = &x->x_gui;
    t_canvas *canvas = glist_getcanvas(glist);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int hmargin = HMARGIN * zoom, vmargin = VMARGIN * zoom;
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int ledw = x->x_led_size * zoom;
    int fs = x->x_gui.x_fontsize * zoom;
    int w4 = x->x_gui.x_w/4, mid = xpos + x->x_gui.x_w/2,
        quad1 = xpos + w4 + zoom;
    int quad3 = xpos + x->x_gui.x_w - w4,
        end = xpos + x->x_gui.x_w + 4*zoom;
    int k1 = (x->x_led_size+1)*zoom, k2 = IEM_VU_STEPS+1, k3 = k1/2;
    int led_col, yyy, k4 = ypos - k3;
    int i;
    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos - hmargin, ypos - vmargin,
        xpos+x->x_gui.x_w + hmargin, ypos+x->x_gui.x_h + vmargin);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-fill", x->x_gui.x_bcol);

    sprintf(tag, "%lxSCALE", x);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_lcol);
    sprintf(tag, "%lxRLED", x);
    pdgui_vmess(0, "crs ri", canvas, "itemconfigure", tag, "-width", ledw);

    for(i = 1; i <= IEM_VU_STEPS + 1; i++)
    {
        sprintf(tag, "%lxRLED%d", x, i);
        led_col = iemgui_vu_col[i];
        yyy = k4 + k1*(k2-i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            quad1, yyy, quad3, yyy);
        pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag,
            "-fill", iemgui_color_hex[led_col]);

        sprintf(tag, "%lxSCALE%d", x, i);
        pdgui_vmess(0, "crs ii", canvas, "coords", tag,
            end, yyy + k3);
        if((i+2) & 3)
            pdgui_vmess(0, "crs rs", canvas, "itemconfigure", tag,
            "-text", (x->x_scale)?iemgui_vu_scale_str[i]:"");
    }

    i = IEM_VU_STEPS + 1;
    yyy = k4 + k1 * (k2 - i);

        /* this was already set in the loop above, overwritten here */
    sprintf(tag, "%lxSCALE%d", x, i);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        end, yyy + k3);

    pdgui_vmess(0, "crs rs", canvas, "itemconfigure", tag,
        "-text", (x->x_scale)?iemgui_vu_scale_str[i]:"");

    sprintf(tag, "%lxRCOVER", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        quad1 - zoom, ypos - zoom,
        quad3 + zoom, ypos - zoom + k1*IEM_VU_STEPS);
    pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
        "-fill", x->x_gui.x_bcol, "-outline", x->x_gui.x_bcol);

    sprintf(tag, "%lxPLED", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        mid, ypos + PEAKHEIGHT * zoom,
        mid, ypos + PEAKHEIGHT * zoom);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", ledw+zoom, /* peak LED is slightly fatter */
        "-fill", x->x_gui.x_bcol);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xpos+x->x_gui.x_ldx * zoom, ypos+x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);

    x->x_updaterms = x->x_updatepeak = 1;
}